

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O1

void __thiscall QBoxLayout::setStretch(QBoxLayout *this,int index,int stretch)

{
  long lVar1;
  
  if (-1 < index) {
    lVar1 = *(long *)&(this->super_QLayout).field_0x8;
    if (((ulong)(uint)index < *(ulong *)(lVar1 + 0xc0)) &&
       (lVar1 = *(long *)(*(long *)(lVar1 + 0xb8) + (ulong)(uint)index * 8),
       *(int *)(lVar1 + 8) != stretch)) {
      *(int *)(lVar1 + 8) = stretch;
      (**(code **)(*(long *)&this->super_QLayout + 0x70))();
      return;
    }
  }
  return;
}

Assistant:

void QBoxLayout::setStretch(int index, int stretch)
{
    Q_D(QBoxLayout);
    if (index >= 0 && index < d->list.size()) {
        QBoxLayoutItem *box = d->list.at(index);
        if (box->stretch != stretch) {
            box->stretch = stretch;
            invalidate();
        }
    }
}